

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_entropyCompressSeqStore
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,size_t srcSize,void *entropyWorkspace,size_t entropyWkspSize,
                 int bmi2)

{
  byte *dstEnd;
  ZSTD_strategy ZVar1;
  ZSTD_paramSwitch_e ZVar2;
  seqDef *sequences;
  seqDef *psVar3;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  BYTE *mlCodeTable;
  uint disableLiteralCompression;
  size_t err_code;
  ulong uVar4;
  byte *pbVar5;
  ZSTD_fseCTables_t *nextEntropy_00;
  byte bVar6;
  size_t srcSize_00;
  uint suspectUncompressible;
  ulong nbSeq;
  ZSTD_symbolEncodingTypeStats_t stats;
  
  sequences = seqStorePtr->sequencesStart;
  psVar3 = seqStorePtr->sequences;
  nbSeq = (long)psVar3 - (long)sequences >> 3;
  srcSize_00 = (long)seqStorePtr->lit - (long)seqStorePtr->litStart;
  ZVar1 = (cctxParams->cParams).strategy;
  ofCodeTable = seqStorePtr->ofCode;
  llCodeTable = seqStorePtr->llCode;
  mlCodeTable = seqStorePtr->mlCode;
  if (psVar3 == sequences) {
    suspectUncompressible = 1;
  }
  else {
    suspectUncompressible = (uint)(0x13 < srcSize_00 / nbSeq);
  }
  ZVar2 = cctxParams->literalCompressionMode;
  disableLiteralCompression = 0;
  if (ZVar2 == ZSTD_ps_auto) {
    if (ZVar1 == ZSTD_fast) {
      disableLiteralCompression = (uint)((cctxParams->cParams).targetLength != 0);
    }
  }
  else if (ZVar2 != ZSTD_ps_enable) {
    if (ZVar2 != ZSTD_ps_disable) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x264,"int ZSTD_literalsCompressionIsDisabled(const ZSTD_CCtx_params *)");
    }
    disableLiteralCompression = 1;
  }
  uVar4 = ZSTD_compressLiterals
                    (dst,dstCapacity,seqStorePtr->litStart,srcSize_00,
                     (void *)((long)entropyWorkspace + 0xd4),0x2204,&prevEntropy->huf,
                     &nextEntropy->huf,ZVar1,disableLiteralCompression,suspectUncompressible,
                     (int)entropyWkspSize);
  if (0xffffffffffffff88 < uVar4) goto LAB_0076ba1d;
  if (dstCapacity < uVar4) {
    __assert_fail("cSize <= dstCapacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xb40,
                  "size_t ZSTD_entropyCompressSeqStore_internal(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, void *, size_t, const int)"
                 );
  }
  if ((long)(dstCapacity - uVar4) < 4) {
    if (srcSize <= dstCapacity) {
      return 0;
    }
    return 0xffffffffffffffba;
  }
  dstEnd = (byte *)((long)dst + dstCapacity);
  pbVar5 = (byte *)(uVar4 + (long)dst);
  if (nbSeq < 0x80) {
    *pbVar5 = (byte)nbSeq;
    pbVar5 = pbVar5 + 1;
  }
  else if (nbSeq < 0x7f00) {
    *pbVar5 = (byte)(nbSeq >> 8) | 0x80;
    pbVar5[1] = (byte)nbSeq;
    pbVar5 = pbVar5 + 2;
  }
  else {
    *pbVar5 = 0xff;
    *(short *)(pbVar5 + 1) = (short)nbSeq + -0x7f00;
    pbVar5 = pbVar5 + 3;
  }
  if (dstEnd < pbVar5) {
    __assert_fail("op <= oend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xb52,
                  "size_t ZSTD_entropyCompressSeqStore_internal(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, void *, size_t, const int)"
                 );
  }
  nextEntropy_00 = &nextEntropy->fse;
  if (psVar3 == sequences) {
    memcpy(nextEntropy_00,&prevEntropy->fse,0xde0);
  }
  else {
    ZSTD_buildSequencesStatistics
              (&stats,seqStorePtr,nbSeq,&prevEntropy->fse,nextEntropy_00,pbVar5 + 1,dstEnd,ZVar1,
               (uint *)entropyWorkspace,(void *)((long)entropyWorkspace + 0xd4),0x2204);
    uVar4 = stats.size;
    if (0xffffffffffffff88 < stats.size) goto LAB_0076ba1d;
    *pbVar5 = (char)(stats.Offtype << 4) + (char)(stats.LLtype << 6) + (char)stats.MLtype * '\x04';
    pbVar5 = pbVar5 + 1 + stats.size;
    uVar4 = ZSTD_encodeSequences
                      (pbVar5,(long)dstEnd - (long)pbVar5,(nextEntropy->fse).matchlengthCTable,
                       mlCodeTable,nextEntropy_00->offcodeCTable,ofCodeTable,
                       (nextEntropy->fse).litlengthCTable,llCodeTable,sequences,nbSeq,
                       stats.longOffsets,(int)entropyWkspSize);
    if (0xffffffffffffff88 < uVar4) goto LAB_0076ba1d;
    pbVar5 = pbVar5 + uVar4;
    if (dstEnd < pbVar5) {
      __assert_fail("op <= oend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xb70,
                    "size_t ZSTD_entropyCompressSeqStore_internal(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, void *, size_t, const int)"
                   );
    }
    if ((stats.lastCountSize != 0) && (uVar4 + stats.lastCountSize < 4)) {
      if (uVar4 + stats.lastCountSize == 3) {
        return 0;
      }
      __assert_fail("lastCountSize + bitstreamSize == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xb7b,
                    "size_t ZSTD_entropyCompressSeqStore_internal(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, void *, size_t, const int)"
                   );
    }
  }
  uVar4 = (long)pbVar5 - (long)dst;
  if ((long)pbVar5 - (long)dst == 0) {
    return 0;
  }
LAB_0076ba1d:
  if ((dstCapacity < srcSize) || (uVar4 != 0xffffffffffffffba)) {
    if (0xffffffffffffff88 < uVar4) {
      return uVar4;
    }
    ZVar1 = (cctxParams->cParams).strategy;
    if (ZVar1 + ~ZSTD_btultra2 < 0xfffffff7) {
      __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_strategy, (int)strat)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,600,"size_t ZSTD_minGain(size_t, ZSTD_strategy)");
    }
    bVar6 = 6;
    if (ZSTD_btopt < ZVar1) {
      bVar6 = (char)ZVar1 - 1;
    }
    if (uVar4 < (srcSize - (srcSize >> (bVar6 & 0x3f))) - 2) {
      if (0x1ffff < uVar4) {
        __assert_fail("cSize < ZSTD_BLOCKSIZE_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0xba7,
                      "size_t ZSTD_entropyCompressSeqStore(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, size_t, void *, size_t, int)"
                     );
      }
      return uVar4;
    }
  }
  return 0;
}

Assistant:

MEM_STATIC size_t
ZSTD_entropyCompressSeqStore(
                    const seqStore_t* seqStorePtr,
                    const ZSTD_entropyCTables_t* prevEntropy,
                          ZSTD_entropyCTables_t* nextEntropy,
                    const ZSTD_CCtx_params* cctxParams,
                          void* dst, size_t dstCapacity,
                          size_t srcSize,
                          void* entropyWorkspace, size_t entropyWkspSize,
                          int bmi2)
{
    size_t const cSize = ZSTD_entropyCompressSeqStore_internal(
                            seqStorePtr, prevEntropy, nextEntropy, cctxParams,
                            dst, dstCapacity,
                            entropyWorkspace, entropyWkspSize, bmi2);
    if (cSize == 0) return 0;
    /* When srcSize <= dstCapacity, there is enough space to write a raw uncompressed block.
     * Since we ran out of space, block must be not compressible, so fall back to raw uncompressed block.
     */
    if ((cSize == ERROR(dstSize_tooSmall)) & (srcSize <= dstCapacity)) {
        DEBUGLOG(4, "not enough dstCapacity (%zu) for ZSTD_entropyCompressSeqStore_internal()=> do not compress block", dstCapacity);
        return 0;  /* block not compressed */
    }
    FORWARD_IF_ERROR(cSize, "ZSTD_entropyCompressSeqStore_internal failed");

    /* Check compressibility */
    {   size_t const maxCSize = srcSize - ZSTD_minGain(srcSize, cctxParams->cParams.strategy);
        if (cSize >= maxCSize) return 0;  /* block not compressed */
    }
    DEBUGLOG(5, "ZSTD_entropyCompressSeqStore() cSize: %zu", cSize);
    /* libzstd decoder before  > v1.5.4 is not compatible with compressed blocks of size ZSTD_BLOCKSIZE_MAX exactly.
     * This restriction is indirectly already fulfilled by respecting ZSTD_minGain() condition above.
     */
    assert(cSize < ZSTD_BLOCKSIZE_MAX);
    return cSize;
}